

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void archive_acl_copy(archive_acl *dest,archive_acl *src)

{
  archive_acl_entry *paVar1;
  archive_acl_entry *ap2;
  archive_acl_entry *ap;
  archive_acl *src_local;
  archive_acl *dest_local;
  
  archive_acl_clear(dest);
  dest->mode = src->mode;
  for (ap2 = src->acl_head; ap2 != (archive_acl_entry *)0x0; ap2 = ap2->next) {
    paVar1 = acl_new_entry(dest,ap2->type,ap2->permset,ap2->tag,ap2->id);
    if (paVar1 != (archive_acl_entry *)0x0) {
      archive_mstring_copy(&paVar1->name,&ap2->name);
    }
  }
  return;
}

Assistant:

void
archive_acl_copy(struct archive_acl *dest, struct archive_acl *src)
{
	struct archive_acl_entry *ap, *ap2;

	archive_acl_clear(dest);

	dest->mode = src->mode;
	ap = src->acl_head;
	while (ap != NULL) {
		ap2 = acl_new_entry(dest,
		    ap->type, ap->permset, ap->tag, ap->id);
		if (ap2 != NULL)
			archive_mstring_copy(&ap2->name, &ap->name);
		ap = ap->next;
	}
}